

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Totals * __thiscall
Catch::Runner2::runTestsForGroup
          (Totals *__return_storage_ptr__,Runner2 *this,Runner *context,TestCaseFilters *filterGroup
          )

{
  TestCaseInfo *pTVar1;
  bool bVar2;
  int iVar3;
  IRegistryHub *pIVar4;
  undefined4 extraout_var;
  undefined8 *puVar5;
  undefined4 extraout_var_00;
  long lVar6;
  iterator iVar7;
  ostream *poVar8;
  TestCaseInfo *testCase;
  Totals local_50;
  
  (__return_storage_ptr__->testCases).passed = 0;
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  pIVar4 = getRegistryHub();
  iVar3 = (*pIVar4->_vptr_IRegistryHub[3])(pIVar4);
  puVar5 = (undefined8 *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))
                     ((long *)CONCAT44(extraout_var,iVar3));
  testCase = (TestCaseInfo *)*puVar5;
  pIVar4 = getRegistryHub();
  iVar3 = (*pIVar4->_vptr_IRegistryHub[3])(pIVar4);
  lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x10))
                    ((long *)CONCAT44(extraout_var_00,iVar3));
  pTVar1 = *(TestCaseInfo **)(lVar6 + 8);
  iVar3 = 0;
  for (; testCase != pTVar1; testCase = testCase + 1) {
    bVar2 = TestCaseFilters::shouldInclude(filterGroup,testCase);
    if (bVar2) {
      iVar3 = iVar3 + 1;
      iVar7 = std::
              _Rb_tree<Catch::TestCaseInfo,_Catch::TestCaseInfo,_std::_Identity<Catch::TestCaseInfo>,_std::less<Catch::TestCaseInfo>,_std::allocator<Catch::TestCaseInfo>_>
              ::find(&(this->m_testsAlreadyRun)._M_t,testCase);
      if ((_Rb_tree_header *)iVar7._M_node ==
          &(this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header) {
        if ((context->m_totals).assertions.failed == (long)(context->m_config->m_data).cutoff)
        break;
        Runner::runTest(&local_50,context,testCase);
        Totals::operator+=(__return_storage_ptr__,&local_50);
        std::
        _Rb_tree<Catch::TestCaseInfo,Catch::TestCaseInfo,std::_Identity<Catch::TestCaseInfo>,std::less<Catch::TestCaseInfo>,std::allocator<Catch::TestCaseInfo>>
        ::_M_insert_unique<Catch::TestCaseInfo_const&>
                  ((_Rb_tree<Catch::TestCaseInfo,Catch::TestCaseInfo,std::_Identity<Catch::TestCaseInfo>,std::less<Catch::TestCaseInfo>,std::allocator<Catch::TestCaseInfo>>
                    *)&this->m_testsAlreadyRun,testCase);
      }
    }
  }
  if (iVar3 == 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"\n[No test cases matched with: ");
    std::__cxx11::string::string((string *)&local_50,(string *)&filterGroup->m_name);
    poVar8 = std::operator<<(poVar8,(string *)&local_50);
    poVar8 = std::operator<<(poVar8,"]");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

Totals runTestsForGroup( Runner& context, const TestCaseFilters& filterGroup ) {
            Totals totals;
            std::vector<TestCaseInfo>::const_iterator it = getRegistryHub().getTestCaseRegistry().getAllTests().begin();
            std::vector<TestCaseInfo>::const_iterator itEnd = getRegistryHub().getTestCaseRegistry().getAllTests().end();
            int testsRunForGroup = 0;
            for(; it != itEnd; ++it ) {
                if( filterGroup.shouldInclude( *it ) ) {
                    testsRunForGroup++;
                    if( m_testsAlreadyRun.find( *it ) == m_testsAlreadyRun.end() ) {

                        if( context.aborting() )
                            break;

                        totals += context.runTest( *it );
                        m_testsAlreadyRun.insert( *it );
                    }
                }
            }
            if( testsRunForGroup == 0 )
                std::cerr << "\n[No test cases matched with: " << filterGroup.getName() << "]" << std::endl;
            return totals;

        }